

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddExtension
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *filename,
          FieldDescriptorProto *field,FileDescriptorProto *value)

{
  bool bVar1;
  LogMessage *pLVar2;
  bool bVar3;
  undefined8 *puVar4;
  int **local_90;
  char *local_88;
  undefined1 local_80 [8];
  undefined8 uStack_78;
  FileDescriptorProto *local_70;
  undefined1 local_68 [32];
  int32_t local_48;
  
  puVar4 = (undefined8 *)((ulong)(field->extendee_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  bVar3 = true;
  if ((puVar4[1] != 0) && (*(char *)*puVar4 == '.')) {
    local_70 = value;
    std::__cxx11::string::substr((ulong)&local_90,(ulong)puVar4);
    local_48 = field->number_;
    if (local_90 == (int **)local_80) {
      local_68._24_8_ = uStack_78;
      local_68._0_8_ = local_68 + 0x10;
    }
    else {
      local_68._0_8_ = local_90;
    }
    local_68._8_8_ = local_88;
    local_88 = (char *)0x0;
    local_80[0] = 0;
    local_90 = (int **)local_80;
    bVar1 = InsertIfNotPresent<std::map<std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>>>
                      (&this->by_extension_,(first_type *)local_68,&local_70);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_);
    }
    if (local_90 != (int **)local_80) {
      operator_delete(local_90);
    }
    if (!bVar1) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                 ,0x115);
      pLVar2 = internal::LogMessage::operator<<
                         ((LogMessage *)local_68,
                          "Extension conflicts with extension already in database: extend ");
      pLVar2 = internal::LogMessage::operator<<
                         (pLVar2,(string *)
                                 ((ulong)(field->extendee_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      pLVar2 = internal::LogMessage::operator<<(pLVar2," { ");
      pLVar2 = internal::LogMessage::operator<<
                         (pLVar2,(string *)
                                 ((ulong)(field->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      pLVar2 = internal::LogMessage::operator<<(pLVar2," = ");
      pLVar2 = internal::LogMessage::operator<<(pLVar2,field->number_);
      pLVar2 = internal::LogMessage::operator<<(pLVar2," } from:");
      pLVar2 = internal::LogMessage::operator<<(pLVar2,filename);
      internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar2);
      internal::LogMessage::~LogMessage((LogMessage *)local_68);
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddExtension(
    const std::string& filename, const FieldDescriptorProto& field,
    Value value) {
  if (!field.extendee().empty() && field.extendee()[0] == '.') {
    // The extension is fully-qualified.  We can use it as a lookup key in
    // the by_symbol_ table.
    if (!InsertIfNotPresent(
            &by_extension_,
            std::make_pair(field.extendee().substr(1), field.number()),
            value)) {
      GOOGLE_LOG(ERROR) << "Extension conflicts with extension already in database: "
                    "extend "
                 << field.extendee() << " { " << field.name() << " = "
                 << field.number() << " } from:" << filename;
      return false;
    }
  } else {
    // Not fully-qualified.  We can't really do anything here, unfortunately.
    // We don't consider this an error, though, because the descriptor is
    // valid.
  }
  return true;
}